

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,SkelRoot *root,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  uint uVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  size_type sVar6;
  ostream *poVar7;
  mapped_type *this;
  _Base_ptr p_Var8;
  Property *prop;
  char *pcVar9;
  int iVar10;
  allocator local_2e9;
  string *local_2e8;
  string *local_2e0;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2d8;
  Property *local_2d0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2c8;
  ParseResult ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_278;
  _Base_ptr local_270;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_268;
  _Base_ptr local_260;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  _Any_data local_228;
  code *local_218;
  _Any_data local_208;
  code *local_1f8;
  ostringstream ss_w;
  code *local_1d8 [45];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = ReconstructXformOpsFromProperties
                    (spec,&table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)root,err);
  if (bVar3) {
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_260 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_268 = &root->extent;
    local_278 = &root->props;
    local_2d8 = &root->purpose;
    local_2c8 = &root->visibility;
    local_2e8 = err;
    local_2e0 = warn;
    while( true ) {
      bVar3 = p_Var8 == local_260;
      if (bVar3) break;
      __lhs = p_Var8 + 1;
      bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"visibility");
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&ss_w,"visibility",(allocator *)&ret);
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(string *)&ss_w);
        ::std::__cxx11::string::_M_dispose();
        if (sVar6 == 0) {
          Property::value_type_name_abi_cxx11_((string *)&ss_w,(Property *)(p_Var8 + 2));
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var5 = ::std::operator==((string *)&ss_w,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret);
          if ((_Var5) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (uVar1 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
              poVar7 = ::std::operator<<((ostream *)&ss_w,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb37);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)&ss_w,"No value assigned to `");
              poVar7 = ::std::operator<<(poVar7,"visibility");
              poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
              ::std::operator<<(poVar7,"\n");
              psVar2 = local_2e0;
              if (local_2e0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,&local_298,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e8);
                ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
              AttrMetas::operator=(&local_2c8->_metas,(AttrMetas *)(p_Var8 + 7));
              pcVar9 = "visibility";
LAB_001b2036:
              ::std::__cxx11::string::string((string *)&ss_w,pcVar9,(allocator *)&ret);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,(string *)&ss_w);
              ::std::__cxx11::string::_M_dispose();
              goto LAB_001b25ec;
            }
          }
          else {
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          _ss_w = VisibilityEnumHandler;
          local_1d8[0] = ::std::
                         _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         ::_M_manager;
          ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_298);
          bVar4 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_208,
                     (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&ss_w);
          bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                            ((string *)&ret,bVar4,(EnumHandlerFun<tinyusdz::Visibility> *)&local_208
                             ,(Attribute *)(p_Var8 + 2),local_2c8,local_2e0,local_2e8);
          if (local_1f8 != (code *)0x0) {
            (*local_1f8)(&local_208,&local_208,__destroy_functor);
          }
          ::std::__cxx11::string::_M_dispose();
          iVar10 = 1;
          if (bVar4) {
            AttrMetas::operator=(&local_2c8->_metas,(AttrMetas *)(p_Var8 + 7));
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_298);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 3;
          }
LAB_001b25d6:
          (*local_1d8[0])(&ss_w,&ss_w,3);
LAB_001b25e1:
          if ((iVar10 != 3) && (iVar10 != 0)) break;
        }
      }
      else {
        bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"purpose");
        if (bVar4) {
          ::std::__cxx11::string::string((string *)&ss_w,"purpose",(allocator *)&ret);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(string *)&ss_w);
          ::std::__cxx11::string::_M_dispose();
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_w,(Property *)(p_Var8 + 2));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var5 = ::std::operator==((string *)&ss_w,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var5) && (uVar1 = *(uint *)((long)&p_Var8[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
                poVar7 = ::std::operator<<((ostream *)&ss_w,"[warn]");
                poVar7 = ::std::operator<<(poVar7,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar7 = ::std::operator<<(poVar7,":");
                poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
                poVar7 = ::std::operator<<(poVar7,"():");
                poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb39);
                ::std::operator<<(poVar7," ");
                poVar7 = ::std::operator<<((ostream *)&ss_w,"No value assigned to `");
                poVar7 = ::std::operator<<(poVar7,"purpose");
                poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
                ::std::operator<<(poVar7,"\n");
                psVar2 = local_2e0;
                if (local_2e0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,&local_298,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2e8);
                  ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
                AttrMetas::operator=(&local_2d8->_metas,(AttrMetas *)(p_Var8 + 7));
                pcVar9 = "purpose";
                goto LAB_001b2036;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_w = PurposeEnumHandler;
            local_1d8[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_298);
            bVar4 = options->strict_allowedToken_check;
            local_2d0 = (Property *)(p_Var8 + 2);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_228,
                       (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_w);
            bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                              ((string *)&ret,bVar4,(EnumHandlerFun<tinyusdz::Purpose> *)&local_228,
                               &local_2d0->_attrib,local_2d8,local_2e0,local_2e8);
            if (local_218 != (code *)0x0) {
              (*local_218)(&local_228,&local_228,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 1;
            if (bVar4) {
              AttrMetas::operator=(&local_2d8->_metas,(AttrMetas *)(p_Var8 + 7));
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_298);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 3;
            }
            goto LAB_001b25d6;
          }
        }
        else {
          ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
          prop = (Property *)(p_Var8 + 2);
          ::std::__cxx11::string::string((string *)&ss_w,"extent",(allocator *)&local_298);
          local_2d0 = prop;
          anon_unknown_0::ParseExtentAttribute(&ret,&table,&local_50,prop,(string *)&ss_w,local_268)
          ;
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          iVar10 = 0;
          if ((ret.code & ~AlreadyProcessed) == Success) {
            bVar4 = false;
            iVar10 = 3;
          }
          else {
            bVar4 = true;
            if (ret.code != Unmatched) {
              local_270 = p_Var8;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
              poVar7 = ::std::operator<<((ostream *)&ss_w,"[error]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb3a);
              ::std::operator<<(poVar7," ");
              ::std::__cxx11::string::string
                        ((string *)&local_70,"Parsing attribute `extent` failed. Error: {}",
                         &local_2e9);
              fmt::format<std::__cxx11::string>
                        (&local_298,(fmt *)&local_70,(string *)&ret.err,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
              poVar7 = ::std::operator<<((ostream *)&ss_w,(string *)&local_298);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar2 = local_2e8;
              if (local_2e8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_298,&local_70,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar2);
                ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_298);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
              bVar4 = false;
              iVar10 = 1;
              p_Var8 = local_270;
            }
          }
          ::std::__cxx11::string::_M_dispose();
          if (!bVar4) goto LAB_001b25e1;
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)__lhs);
          if (sVar6 == 0) {
            this = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](local_278,(key_type *)__lhs);
            Property::operator=(this,local_2d0);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
          }
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)__lhs);
          if (sVar6 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
            poVar7 = ::std::operator<<((ostream *)&ss_w,"[warn]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb3c);
            ::std::operator<<(poVar7," ");
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __lhs);
            poVar7 = ::std::operator<<((ostream *)&ss_w,(string *)&ret);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::_M_dispose();
            psVar2 = local_2e0;
            if (local_2e0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,&local_298,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2e8);
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
          }
        }
      }
LAB_001b25ec:
      p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
    }
  }
  else {
    bVar3 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar3;
}

Assistant:

bool ReconstructPrim<SkelRoot>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelRoot *root,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &root->xformOps, err)) {
    return false;
  }

  // SkelRoot is something like a grouping node, having 1 Skeleton and possibly?
  // multiple Prim hierarchy containing GeomMesh.
  // No specific properties for SkelRoot(AFAIK)

  // custom props only
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, SkelRoot,
                   root->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, SkelRoot,
                       root->purpose, options.strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, SkelRoot, root->extent)
    ADD_PROPERTY(table, prop, SkelRoot, root->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}